

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall QRhiGles2::dispatch(QRhiGles2 *this,QRhiCommandBuffer *cb,int x,int y,int z)

{
  char **this_00;
  uchar *puVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  long lVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Entry *pEVar9;
  int iVar10;
  Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *pDVar11;
  Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *pDVar12;
  _func_int **pp_Var13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long in_FS_OFFSET;
  bool bVar22;
  piter pVar23;
  piter it;
  QRhiResource *local_50;
  QRhiResource *local_48;
  pair<int,_bool> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (cb[5].super_QRhiResource.m_objectName.d.size == 0) goto LAB_0056dd98;
  this_00 = &cb[0x11].super_QRhiResource.m_objectName.d.ptr;
  pDVar11 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
            cb[0x11].super_QRhiResource.m_objectName.d.ptr;
  if (pDVar11 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) {
    pDVar11 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
LAB_0056d9d2:
    uVar15 = 0;
    pDVar12 = pDVar11;
    pDVar11 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
LAB_0056d9d4:
    if (uVar15 != 0 ||
        pDVar11 != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0)
    goto LAB_0056d9e2;
  }
  else {
    if (1 < (uint)(pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar11 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
                detached(pDVar11);
      *this_00 = (char *)pDVar11;
    }
    pDVar12 = pDVar11;
    if (pDVar11->spans->offsets[0] == 0xff) {
      uVar19 = 1;
      do {
        uVar15 = uVar19;
        if (pDVar11->numBuckets == uVar15) goto LAB_0056d9d2;
        uVar19 = uVar15 + 1;
      } while (pDVar11->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
      goto LAB_0056d9d4;
    }
    uVar15 = 0;
LAB_0056d9e2:
    do {
      pSVar3 = pDVar11->spans;
      pEVar4 = pSVar3[uVar15 >> 7].entries;
      bVar2 = pSVar3[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f];
      pEVar9 = pEVar4 + bVar2;
      (pEVar9->storage).data[8] = '\0';
      (pEVar9->storage).data[9] = '\0';
      (pEVar9->storage).data[10] = '\0';
      (pEVar9->storage).data[0xb] = '\0';
      pEVar4[bVar2].storage.data[0xc] = '\0';
      do {
        if (pDVar11->numBuckets - 1 == uVar15) {
          uVar15 = 0;
          pDVar11 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (pSVar3[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
    } while ((uVar15 != 0) ||
            (pDVar11 != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0));
  }
  lVar14 = cb[5].super_QRhiResource.m_objectName.d.size;
  uVar18 = (uint)*(undefined8 *)(lVar14 + 0x38);
  if (0 < (int)uVar18) {
    uVar19 = (ulong)(uVar18 & 0x7fffffff);
    lVar20 = 0x10;
    do {
      lVar5 = *(long *)(lVar14 + 0x40);
      uVar18 = *(uint *)(lVar5 + -8 + lVar20);
      if (uVar18 - 7 < 3) {
        local_50 = *(QRhiResource **)(lVar5 + lVar20);
        uVar16 = uVar18 == 9 | 2;
        pVar23 = (piter)QHash<QRhiResource*,std::pair<int,bool>>::findImpl<QRhiResource*>
                                  ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_50);
        if (pVar23.d == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
            pVar23.bucket == 0) {
          if ((uVar18 & 0xfffffffe) == 8) {
LAB_0056db42:
            local_40.first = uVar16;
            local_40.second = true;
            local_48 = local_50;
            QHash<QRhiResource*,std::pair<int,bool>>::emplace<std::pair<int,bool>const&>
                      ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_48,&local_40);
          }
        }
        else {
          bVar22 = uVar18 == 7;
LAB_0056db01:
          if (bVar22) {
            uVar16 = 1;
          }
          pSVar3 = (pVar23.d)->spans;
          uVar15 = pVar23.bucket >> 7;
          puVar1 = pSVar3[uVar15].entries[pSVar3[uVar15].offsets[(uint)pVar23.bucket & 0x7f]].
                   storage.data + 8;
          *(uint *)puVar1 = *(uint *)puVar1 | uVar16;
        }
      }
      else if (uVar18 - 4 < 3) {
        local_50 = *(QRhiResource **)(lVar5 + lVar20);
        uVar16 = uVar18 == 6 | 2;
        pVar23 = (piter)QHash<QRhiResource*,std::pair<int,bool>>::findImpl<QRhiResource*>
                                  ((QHash<QRhiResource*,std::pair<int,bool>> *)this_00,&local_50);
        if (pVar23.d != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 ||
            pVar23.bucket != 0) {
          bVar22 = uVar18 == 4;
          goto LAB_0056db01;
        }
        if (uVar18 - 5 < 2) goto LAB_0056db42;
      }
      lVar20 = lVar20 + 0x118;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    pDVar12 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)*this_00;
  }
  if (pDVar12 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) {
    pDVar12 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
    sVar17 = 0;
LAB_0056dc3f:
    if (pDVar12 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
        sVar17 == 0) goto LAB_0056dd98;
  }
  else {
    if (1 < (uint)(pDVar12->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar12 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
                detached(pDVar12);
      *this_00 = (char *)pDVar12;
    }
    if (pDVar12->spans->offsets[0] == 0xff) {
      uVar19 = 1;
      do {
        sVar17 = uVar19;
        if (pDVar12->numBuckets == sVar17) {
          pDVar12 = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0;
          sVar17 = 0;
          break;
        }
        uVar19 = sVar17 + 1;
      } while (pDVar12->spans[sVar17 >> 7].offsets[(uint)sVar17 & 0x7f] == 0xff);
      goto LAB_0056dc3f;
    }
    sVar17 = 0;
  }
  it.bucket = sVar17;
  it.d = pDVar12;
  uVar18 = 0;
  do {
    uVar19 = it.bucket;
    pDVar11 = it.d;
    pEVar4 = pDVar11->spans[uVar19 >> 7].entries;
    bVar2 = pDVar11->spans[uVar19 >> 7].offsets[(uint)it.bucket & 0x7f];
    iVar21 = *(int *)(pEVar4[bVar2].storage.data + 8);
    if (iVar21 == 0) {
LAB_0056dcc9:
      do {
        if (pDVar11->numBuckets - 1 == uVar19) {
          it = (piter)ZEXT816(0);
          break;
        }
        uVar19 = uVar19 + 1;
        it.bucket = uVar19;
        it.d = pDVar11;
      } while (pDVar11->spans[uVar19 >> 7].offsets[(uint)uVar19 & 0x7f] == 0xff);
    }
    else {
      if (pEVar4[bVar2].storage.data[0xc] == '\0') {
        iVar10 = (**(code **)(**(long **)pEVar4[bVar2].storage.data + 0x10))();
        if (iVar10 == 1) {
          uVar18 = uVar18 | 0x20;
        }
        else {
          uVar18 = uVar18 | 0x2000;
        }
      }
      if (iVar21 != 1) goto LAB_0056dcc9;
      it = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::erase
                            ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00,
                             (const_iterator)it);
    }
  } while ((it.d != (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) ||
          (it.bucket != 0));
  if (uVar18 != 0) {
    iVar21 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
    if (iVar21 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
      uVar19 = (long)iVar21 + 0x400;
      *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar19;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar19;
      uVar19 = 0xffffffffffffffff;
      if (SUB168(auVar7 * ZEXT816(0x68),8) == 0) {
        uVar19 = SUB168(auVar7 * ZEXT816(0x68),0);
      }
      pp_Var13 = (_func_int **)operator_new__(uVar19);
      pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
      if (pp_Var6 != (_func_int **)0x0) {
        memcpy(pp_Var13,pp_Var6,(long)iVar21 * 0x68);
        operator_delete__(pp_Var6);
        iVar21 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
      }
      cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
    }
    else {
      pp_Var13 = cb[1].super_QRhiResource._vptr_QRhiResource;
    }
    *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar21 + 1;
    *(undefined4 *)(pp_Var13 + (long)iVar21 * 0xd) = 0x1c;
    *(uint *)(pp_Var13 + (long)iVar21 * 0xd + 1) = uVar18;
  }
LAB_0056dd98:
  iVar21 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
  if (iVar21 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
    uVar19 = (long)iVar21 + 0x400;
    *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar19;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar19;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x68),8) == 0) {
      uVar19 = SUB168(auVar8 * ZEXT816(0x68),0);
    }
    pp_Var13 = (_func_int **)operator_new__(uVar19);
    pp_Var6 = cb[1].super_QRhiResource._vptr_QRhiResource;
    if (pp_Var6 != (_func_int **)0x0) {
      memcpy(pp_Var13,pp_Var6,(long)iVar21 * 0x68);
      operator_delete__(pp_Var6);
      iVar21 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
    }
    cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
  }
  else {
    pp_Var13 = cb[1].super_QRhiResource._vptr_QRhiResource;
  }
  *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar21 + 1;
  lVar14 = (long)iVar21;
  *(undefined4 *)(pp_Var13 + lVar14 * 0xd) = 0x1a;
  *(int *)(pp_Var13 + lVar14 * 0xd + 1) = x;
  *(int *)((long)pp_Var13 + lVar14 * 0x68 + 0xc) = y;
  *(int *)(pp_Var13 + lVar14 * 0xd + 2) = z;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::dispatch(QRhiCommandBuffer *cb, int x, int y, int z)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::ComputePass);

    if (cbD->currentComputeSrb) {
        GLbitfield barriers = 0;

        // The key in the writtenResources map indicates that the resource was
        // written in a previous dispatch, whereas the value accumulates the
        // access mask in the current one.
        for (auto &accessAndIsNewFlag : cbD->computePassState.writtenResources)
            accessAndIsNewFlag = { 0, false };

        QGles2ShaderResourceBindings *srbD = QRHI_RES(QGles2ShaderResourceBindings, cbD->currentComputeSrb);
        const int bindingCount = srbD->m_bindings.size();
        for (int i = 0; i < bindingCount; ++i) {
            const QRhiShaderResourceBinding::Data *b = shaderResourceBindingData(srbD->m_bindings.at(i));
            switch (b->type) {
            case QRhiShaderResourceBinding::ImageLoad:
            case QRhiShaderResourceBinding::ImageStore:
            case QRhiShaderResourceBinding::ImageLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.simage.tex,
                                                 b->type,
                                                 QRhiShaderResourceBinding::ImageLoad,
                                                 QRhiShaderResourceBinding::ImageStore,
                                                 QRhiShaderResourceBinding::ImageLoadStore);
                break;
            case QRhiShaderResourceBinding::BufferLoad:
            case QRhiShaderResourceBinding::BufferStore:
            case QRhiShaderResourceBinding::BufferLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.sbuf.buf,
                                                 b->type,
                                                 QRhiShaderResourceBinding::BufferLoad,
                                                 QRhiShaderResourceBinding::BufferStore,
                                                 QRhiShaderResourceBinding::BufferLoadStore);
                break;
            default:
                break;
            }
        }

        for (auto it = cbD->computePassState.writtenResources.begin(); it != cbD->computePassState.writtenResources.end(); ) {
            const int accessInThisDispatch = it->first;
            const bool isNewInThisDispatch = it->second;
            if (accessInThisDispatch && !isNewInThisDispatch) {
                if (it.key()->resourceType() == QRhiResource::Texture)
                    barriers |= GL_SHADER_IMAGE_ACCESS_BARRIER_BIT;
                else
                    barriers |= GL_SHADER_STORAGE_BARRIER_BIT;
            }
            // Anything that was previously written, but is only read now, can be
            // removed from the written list (because that previous write got a
            // corresponding barrier now).
            if (accessInThisDispatch == QGles2CommandBuffer::ComputePassState::Read)
                it = cbD->computePassState.writtenResources.erase(it);
            else
                ++it;
        }

        if (barriers) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::Barrier;
            cmd.args.barrier.barriers = barriers;
        }
    }

    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
    cmd.cmd = QGles2CommandBuffer::Command::Dispatch;
    cmd.args.dispatch.x = GLuint(x);
    cmd.args.dispatch.y = GLuint(y);
    cmd.args.dispatch.z = GLuint(z);
}